

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
connect<cursespp::ListOverlay>
          (signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local> *this,
          ListOverlay *pclass,offset_in_ListOverlay_to_subr pmemfun)

{
  _func_int **in_RCX;
  lock_block<sigslot::multi_threaded_local> lock;
  value_type local_28;
  
  lock.m_mutex = (multi_threaded_local *)this;
  (*(this->super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  local_28 = (value_type)operator_new(0x20);
  local_28->_vptr__connection_base2 = (_func_int **)&PTR___connection2_001c0940;
  local_28[1]._vptr__connection_base2 = (_func_int **)pclass;
  local_28[2]._vptr__connection_base2 = (_func_int **)pmemfun;
  local_28[3]._vptr__connection_base2 = in_RCX;
  std::__cxx11::
  list<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
  ::push_back(&(this->
               super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
               ).m_connected_slots,&local_28);
  has_slots<sigslot::multi_threaded_local>::signal_connect
            (&pclass->super_has_slots<sigslot::multi_threaded_local>,
             (_signal_base<sigslot::multi_threaded_local> *)this);
  lock_block<sigslot::multi_threaded_local>::~lock_block(&lock);
  return;
}

Assistant:

void connect(desttype* pclass, void (desttype::*pmemfun)(arg1_type,
			arg2_type))
		{
			lock_block<mt_policy> lock(this);
			_connection2<desttype, arg1_type, arg2_type, mt_policy>* conn = new
				_connection2<desttype, arg1_type, arg2_type, mt_policy>(pclass, pmemfun);
			this->m_connected_slots.push_back(conn);
			pclass->signal_connect(this);
		}